

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void addstr2buff(BuffFS *buff,char *str,size_t slen)

{
  ulong __n;
  size_t nsize;
  char *local_40;
  char *newb;
  size_t newsize;
  size_t left;
  size_t slen_local;
  char *str_local;
  BuffFS *buff_local;
  
  __n = buff->buffsize - buff->blen;
  if (buff->err != 0) {
    return;
  }
  if (__n < slen) {
    if (0x3fffffffffffffff - buff->blen < slen) {
      memcpy(buff->b + buff->blen,str,__n);
      buff->blen = buff->buffsize;
      buff->err = 2;
      return;
    }
    nsize = buff->buffsize + slen;
    if (buff->b == buff->space) {
      local_40 = (char *)luaM_realloc_(buff->L,(void *)0x0,0,nsize);
    }
    else {
      local_40 = (char *)luaM_realloc_(buff->L,buff->b,buff->buffsize,nsize);
    }
    if (local_40 == (char *)0x0) {
      buff->err = 1;
      return;
    }
    if (buff->b == buff->space) {
      memcpy(local_40,buff->b,buff->blen);
    }
    buff->b = local_40;
    buff->buffsize = nsize;
  }
  memcpy(buff->b + buff->blen,str,slen);
  buff->blen = slen + buff->blen;
  return;
}

Assistant:

static void addstr2buff (BuffFS *buff, const char *str, size_t slen) {
  size_t left = buff->buffsize - buff->blen;  /* space left in the buffer */
  if (buff->err)  /* do nothing else after an error */
    return;
  if (slen > left) {  /* new string doesn't fit into current buffer? */
    if (slen > ((MAX_SIZE/2) - buff->blen)) {  /* overflow? */
      memcpy(buff->b + buff->blen, str, left);  /* copy what it can */
      buff->blen = buff->buffsize;
      buff->err = 2;  /* doesn't add anything else */
      return;
    }
    else {
      size_t newsize = buff->buffsize + slen;  /* limited to MAX_SIZE/2 */
      char *newb =
        (buff->b == buff->space)  /* still using static space? */
        ? luaM_reallocvector(buff->L, NULL, 0, newsize, char)
        : luaM_reallocvector(buff->L, buff->b, buff->buffsize, newsize,
                                                               char);
      if (newb == NULL) {  /* allocation error? */
        buff->err = 1;  /* signal a memory error */
        return;
      }
      if (buff->b == buff->space)  /* new buffer (not reallocated)? */
        memcpy(newb, buff->b, buff->blen);  /* copy previous content */
      buff->b = newb;  /* set new (larger) buffer... */
      buff->buffsize = newsize;  /* ...and its new size */
    }
  }
  memcpy(buff->b + buff->blen, str, slen);  /* copy new content */
  buff->blen += slen;
}